

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O2

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<signed_char,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  pointer puVar1;
  long lVar2;
  DataBuffer *pDVar3;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  byte bVar8;
  
  lVar2 = this->byte_stride_;
  pDVar3 = this->buffer_;
  puVar4 = (pDVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar5 = this->byte_offset_;
  uVar6 = 0;
  while( true ) {
    bVar8 = this->num_components_;
    uVar7 = (ulong)bVar8;
    if (out_num_components <= bVar8) {
      bVar8 = out_num_components;
    }
    if (bVar8 <= uVar6) goto LAB_00154951;
    puVar1 = puVar4 + uVar6 + lVar5 + (ulong)att_id.value_ * lVar2;
    if ((pDVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish <= puVar1) break;
    out_value[uVar6] = (long)(char)*puVar1;
    uVar6 = uVar6 + 1;
  }
LAB_00154956:
  return bVar8 <= uVar6;
LAB_00154951:
  for (; uVar7 < out_num_components; uVar7 = uVar7 + 1) {
    out_value[uVar7] = 0;
  }
  goto LAB_00154956;
}

Assistant:

inline int64_t GetBytePos(AttributeValueIndex att_index) const {
    return byte_offset_ + byte_stride_ * att_index.value();
  }